

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::QueryCapabilitiesResponse::ParseFromArray
          (QueryCapabilitiesResponse *this,void *raw,size_t size)

{
  _Head_base<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_false> _Var1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_58;
  uint16_t local_54;
  uint8_t local_52;
  QueryCapabilitiesResponse *local_50;
  bitset<2UL> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uint64_t payload_length_1;
  
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_50 = this;
  do {
    if (end <= raw) goto switchD_00301497_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_0030145e;
LAB_00301798:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_00301593;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_0030145e:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_00301798;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_00301593;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_00301497_caseD_3;
      int_value = *puVar5;
LAB_003014e4:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_00301497_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_00301497_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_003014e4;
      }
      goto switchD_00301497_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_00301593:
  local_48 = &local_50->_has_field_;
LAB_003015a9:
  do {
    preamble = uVar6;
    local_58 = (uint32_t)uVar8;
    local_52 = (uint8_t)(uVar8 >> 0x30);
    local_54 = (uint16_t)(uVar8 >> 0x20);
    if (local_54 == 1) {
      std::bitset<2UL>::set(local_48,1,true);
      if (local_54 != 1) goto LAB_00301609;
      _Var1._M_head_impl =
           (local_50->capabilities_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::TracingServiceCapabilities,_std::default_delete<perfetto::protos::gen::TracingServiceCapabilities>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_std::default_delete<perfetto::protos::gen::TracingServiceCapabilities>_>
           .super__Head_base<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_false>.
           _M_head_impl;
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var1._M_head_impl,preamble,local_58);
    }
    else {
      if ((uVar8 & 0xffff00000000) == 0) {
        return end == (uint64_t *)raw;
      }
LAB_00301609:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_40);
    }
    do {
      if (end <= raw) {
LAB_00301775:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_003015a9;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_00301775;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_00301775;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_003015a9;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_0030167e_caseD_3;
        payload_length = *puVar5;
LAB_003016d5:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_0030167e_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_0030167e_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_003016d5;
        }
        goto switchD_0030167e_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_00301497_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_00301593;
switchD_0030167e_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_003015a9;
}

Assistant:

bool QueryCapabilitiesResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* capabilities */:
        (*capabilities_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}